

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

int Fra_ImpRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vImps)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  Fra_Sml_t *pFVar7;
  void **ppvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  iVar10 = vImps->nSize;
  if (iVar10 < 1) {
    iVar9 = 0;
  }
  else {
    piVar5 = vImps->pArray;
    lVar12 = 0;
    iVar9 = 0;
    do {
      uVar1 = piVar5[lVar12];
      if (uVar1 != 0) {
        pVVar6 = p->pManAig->vObjs;
        uVar2 = pVVar6->nSize;
        if ((((int)uVar2 <= (int)(uVar1 & 0xffff)) || (uVar13 = (int)uVar1 >> 0x10, (int)uVar13 < 0)
            ) || (uVar2 <= uVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pFVar7 = p->pSml;
        iVar3 = pFVar7->nWordsTotal;
        iVar4 = pFVar7->nWordsPref;
        if (iVar4 < iVar3) {
          ppvVar8 = pVVar6->pArray;
          lVar11 = 0;
          do {
            if ((*(uint *)((long)&pFVar7[1].pAig +
                          lVar11 * 4 +
                          (long)(*(int *)((long)ppvVar8[(ushort)uVar1] + 0x24) * iVar3) * 4 +
                          (long)iVar4 * 4) &
                ~*(uint *)((long)&pFVar7[1].pAig +
                          lVar11 * 4 +
                          (long)(*(int *)((long)ppvVar8[uVar13] + 0x24) * iVar3) * 4 +
                          (long)iVar4 * 4)) != 0) {
              piVar5[lVar12] = 0;
              iVar10 = vImps->nSize;
              iVar9 = 1;
              break;
            }
            lVar11 = lVar11 + 1;
          } while (iVar3 - iVar4 != (int)lVar11);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar10);
  }
  return iVar9;
}

Assistant:

int Fra_ImpRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vImps )
{
    Aig_Obj_t * pLeft, * pRight;
    int Imp, i, RetValue = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if implication holds using this simulation info
        if ( !Sml_NodeCheckImp(p->pSml, pLeft->Id, pRight->Id) )
        {
            Vec_IntWriteEntry( vImps, i, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}